

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O1

void __thiscall Array_sub_ranges_by_index_Test::TestBody(Array_sub_ranges_by_index_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  int iVar3;
  int i;
  long lVar4;
  char *pcVar5;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  actual;
  AssertionResult gtest_ar_2;
  by_value v2;
  array_reference_type r1;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  internal local_70;
  undefined7 uStack_6f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelperData *pAStack_60;
  void *local_50;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_48;
  
  iVar3 = posix_memalign((void **)&local_70,8,0x50);
  lVar4 = 0;
  local_50 = (void *)0x0;
  if (iVar3 == 0) {
    local_50 = (void *)CONCAT71(uStack_6f,local_70);
  }
  do {
    *(double *)((long)local_50 + lVar4 * 8) = (double)(int)lVar4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  pAVar1 = (AssertHelperData *)((long)local_50 + 0x28);
  local_48.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .size_ = (size_type)&DAT_00000005;
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  local_90.data_._0_4_ = 5;
  local_48.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .pointer_ = (pointer)pAVar1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (&local_70,"r1.size()","5",(unsigned_long *)&local_88,(int *)&local_90);
  if (local_70 == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x65,pcVar5);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_ =
       (AssertHelperData *)
       local_48.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar1;
  testing::internal::CmpHelperEQ<double*,double*>
            (&local_70,"v1.data()+5","r1.data()",(double **)&local_88,(double **)&local_90);
  if (local_70 == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
              *)&local_70,&local_48);
  local_90.data_ =
       (AssertHelperData *)
       local_48.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_78.data_ = (AssertHelperData *)local_68.ptr_;
  testing::internal::CmpHelperNE<double*,double*>
            ((internal *)&local_88,"r1.data()","v2.data()",(double **)&local_90,(double **)&local_78
            );
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x6b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_ =
       (AssertHelperData *)
       local_48.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .size_;
  local_78.data_ = pAStack_60;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"r1.size()","v2.size()",(unsigned_long *)&local_90,
             (unsigned_long *)&local_78);
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x6c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar4 = 0x28;
  actual.ptr_ = local_68.ptr_;
  do {
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_88,"it1[i+5]","it2[i]",(double *)((long)local_50 + lVar4),
               (double *)actual.ptr_);
    if (local_88.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_90);
      pcVar5 = "";
      if (local_80.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = ((local_80.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
                 ,0x70,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
        local_90.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    actual.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(actual.ptr_)->_M_string_length;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x50);
  if (local_68.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    free(local_68.ptr_);
  }
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pAStack_60 = (AssertHelperData *)0x0;
  if (local_50 != (void *)0x0) {
    free(local_50);
  }
  return;
}

Assistant:

TEST(Array, sub_ranges_by_index) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // check that reference range from a subrange works
    by_value v1(10);
    for(int i=0; i<10; i++)
        v1[i] = double(i);

    // create a reference wrapper to the second half of v1
    auto r1 = v1(5,end);
    EXPECT_EQ(r1.size(), 5);
    EXPECT_EQ(v1.data()+5, r1.data());

    // create a value wrapper (copy) of the reference range
    // should contain a copy of the second half of v1
    by_value v2(r1);
    EXPECT_NE(r1.data(), v2.data());
    EXPECT_EQ(r1.size(), v2.size());
    auto it1 = v1.data();
    auto it2 = v2.data();
    for(auto i=0; i<5; ++i) {
        EXPECT_EQ(it1[i+5], it2[i]);
    }
}